

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall kj::TaskSet::destroyTasks(TaskSet *this)

{
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:422:3)>
  _kjDefer429;
  OwnTask removed;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:422:3)>
  local_28;
  
  local_28.maybeFunc.ptr.isSet = true;
  local_28.maybeFunc.ptr.field_1 =
       (anon_union_8_1_a8c68091_for_NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:422:3)>_2
        )this;
  while ((this->tasks).ptr.ptr != (Task *)0x0) {
    Task::pop((Task *)&stack0xffffffffffffffe8);
    Own<kj::TaskSet::Task,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::TaskSet::Task,_kj::_::PromiseDisposer> *)&stack0xffffffffffffffe8);
  }
  kj::_::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++:422:3)>
  ::~Deferred(&local_28);
  return;
}

Assistant:

void TaskSet::destroyTasks() {
  // You could argue it is dubious, but some applications would like for the destructor of a
  // task to be able to schedule new tasks. So when we cancel our tasks... we might find new
  // tasks added! We'll have to repeatedly cancel. Additionally, we need to make sure that we destroy
  // the items in a loop to prevent any issues with stack overflow.

  KJ_DEFER({
    // If an exception occurs, ensure the remaining tasks still get unlinked.  Here, we assume it
    // is not necessary to catch further exceptions, since we require destructors to guard against
    // exceptions when unwinding.
    while (tasks != kj::none) {
      auto removed = KJ_REQUIRE_NONNULL(tasks)->pop();
    }
  });

  while (tasks != kj::none) {
    auto removed = KJ_REQUIRE_NONNULL(tasks)->pop();
  }
}